

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void print_stack_union(FILE *out,lemon *lemp,int *plineno,int mhflag)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  byte *__s;
  symbol **ppsVar4;
  symbol *psVar5;
  symbol *psVar6;
  ushort *puVar7;
  void *__ptr;
  char *__nmemb;
  int iVar8;
  uint uVar9;
  void *__ptr_00;
  size_t sVar10;
  size_t sVar11;
  char *__s1;
  ushort **ppuVar12;
  char *__dest;
  char cVar13;
  byte *pbVar14;
  int iVar15;
  ulong uVar16;
  char *pcVar17;
  char *pcVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  byte *pbVar22;
  uint local_60;
  
  iVar3 = lemp->nsymbol;
  lVar20 = (long)iVar3;
  __nmemb = (char *)(lVar20 * 2);
  pcVar17 = (char *)0x8;
  pcVar18 = __nmemb;
  __ptr_00 = calloc((size_t)__nmemb,8);
  if (__ptr_00 == (void *)0x0) {
LAB_0010c0e3:
    print_stack_union_cold_3();
  }
  else {
    __s = (byte *)lemp->vartype;
    if (__s == (byte *)0x0) {
      sVar10 = 0;
    }
    else {
      sVar10 = strlen((char *)__s);
    }
    iVar8 = (int)sVar10;
    if (0 < iVar3) {
      ppsVar4 = lemp->symbols;
      lVar21 = 0;
      do {
        pcVar18 = ppsVar4[lVar21]->datatype;
        if (pcVar18 != (char *)0x0) {
          sVar11 = strlen(pcVar18);
          uVar9 = (uint)sVar11;
          if ((int)(uint)sVar11 < (int)(uint)sVar10) {
            uVar9 = (uint)sVar10;
          }
          sVar10 = (size_t)uVar9;
        }
        iVar8 = (int)sVar10;
        lVar21 = lVar21 + 1;
      } while (lVar20 != lVar21);
    }
    pcVar18 = (char *)(long)(iVar8 * 2 + 1);
    __s1 = (char *)malloc((size_t)pcVar18);
    if (__s1 != (char *)0x0) {
      local_60 = (uint)__nmemb;
      if (0 < iVar3) {
        ppsVar4 = lemp->symbols;
        psVar5 = lemp->errsym;
        lVar21 = 0;
        do {
          psVar6 = ppsVar4[lVar21];
          if (psVar6 == psVar5) {
            psVar6->dtnum = local_60 | 1;
          }
          else if ((psVar6->type == NONTERMINAL) &&
                  (pbVar22 = (byte *)psVar6->datatype, __s != (byte *)0x0 || pbVar22 != (byte *)0x0)
                  ) {
            if (pbVar22 == (byte *)0x0) {
              pbVar22 = __s;
            }
            ppuVar12 = __ctype_b_loc();
            puVar7 = *ppuVar12;
            pbVar14 = pbVar22 + -1;
            do {
              pbVar22 = pbVar22 + 1;
              pbVar1 = pbVar14 + 1;
              uVar19 = (ulong)*pbVar1;
              pbVar14 = pbVar14 + 1;
            } while ((*(byte *)((long)puVar7 + uVar19 * 2 + 1) & 0x20) != 0);
            iVar8 = 0;
            if (*pbVar1 != 0) {
              uVar16 = 0;
              do {
                __s1[uVar16] = (char)uVar19;
                uVar16 = uVar16 + 1;
                bVar2 = *pbVar22;
                uVar19 = (ulong)bVar2;
                pbVar22 = pbVar22 + 1;
              } while (bVar2 != 0);
              if ((int)uVar16 < 1) {
LAB_0010be54:
                iVar8 = (int)uVar16;
              }
              else {
                do {
                  iVar15 = (int)uVar16;
                  if ((*(byte *)((long)puVar7 + (ulong)(byte)__s1[(uVar16 & 0xffffffff) - 1] * 2 + 1
                                ) & 0x20) == 0) goto LAB_0010be54;
                  uVar16 = (ulong)(iVar15 - 1);
                } while (1 < iVar15);
              }
            }
            __s1[iVar8] = '\0';
            pcVar17 = lemp->tokentype;
            if ((pcVar17 == (char *)0x0) || (iVar8 = strcmp(__s1,pcVar17), iVar8 != 0)) {
              cVar13 = *__s1;
              uVar9 = 0;
              pcVar18 = __s1;
              if (cVar13 != '\0') {
                do {
                  pcVar17 = (char *)(ulong)(uVar9 * 0x35);
                  uVar9 = (int)cVar13 + uVar9 * 0x35;
                  cVar13 = pcVar18[1];
                  pcVar18 = pcVar18 + 1;
                } while (cVar13 != '\0');
                uVar9 = uVar9 & 0x7fffffff;
              }
              uVar19 = (ulong)uVar9 % ((ulong)__nmemb & 0xffffffff);
              while( true ) {
                pcVar18 = *(char **)((long)__ptr_00 + uVar19 * 8);
                if (pcVar18 == (char *)0x0) break;
                pcVar17 = __s1;
                iVar8 = strcmp(pcVar18,__s1);
                uVar9 = (int)uVar19 + 1;
                if (iVar8 == 0) {
                  psVar6->dtnum = uVar9;
                  goto LAB_0010bf2d;
                }
                if (local_60 <= uVar9) {
                  uVar9 = 0;
                }
                uVar19 = (ulong)uVar9;
              }
              psVar6->dtnum = (int)uVar19 + 1;
              sVar10 = strlen(__s1);
              pcVar18 = (char *)(long)((int)sVar10 + 1);
              __dest = (char *)malloc((size_t)pcVar18);
              *(char **)((long)__ptr_00 + uVar19 * 8) = __dest;
              if (__dest == (char *)0x0) {
                print_stack_union_cold_1();
                goto LAB_0010c0e3;
              }
              strcpy(__dest,__s1);
            }
            else {
              psVar6->dtnum = 0;
            }
          }
          else {
            psVar6->dtnum = 0;
          }
LAB_0010bf2d:
          lVar21 = lVar21 + 1;
        } while (lVar21 != lVar20);
      }
      pcVar17 = "Parse";
      if (lemp->name != (char *)0x0) {
        pcVar17 = lemp->name;
      }
      iVar8 = *plineno;
      if (mhflag != 0) {
        fwrite("#if INTERFACE\n",0xe,1,(FILE *)out);
        iVar8 = iVar8 + 1;
      }
      pcVar18 = "void*";
      if (lemp->tokentype != (char *)0x0) {
        pcVar18 = lemp->tokentype;
      }
      fprintf((FILE *)out,"#define %sTOKENTYPE %s\n",pcVar17,pcVar18);
      if (mhflag == 0) {
        iVar8 = iVar8 + 1;
      }
      else {
        fwrite("#endif\n",7,1,(FILE *)out);
        iVar8 = iVar8 + 2;
      }
      fwrite("typedef union {\n",0x10,1,(FILE *)out);
      fwrite("  int yyinit;\n",0xe,1,(FILE *)out);
      fprintf((FILE *)out,"  %sTOKENTYPE yy0;\n",pcVar17);
      iVar8 = iVar8 + 3;
      if (0 < iVar3) {
        uVar19 = 0;
        do {
          __ptr = *(void **)((long)__ptr_00 + uVar19 * 8);
          if (__ptr != (void *)0x0) {
            fprintf((FILE *)out,"  %s yy%d;\n",__ptr,(ulong)((int)uVar19 + 1));
            iVar8 = iVar8 + 1;
            free(__ptr);
          }
          uVar19 = uVar19 + 1;
        } while (((ulong)__nmemb & 0xffffffff) != uVar19);
      }
      if (lemp->errsym->useCnt != 0) {
        fprintf((FILE *)out,"  int yy%d;\n",(ulong)(uint)lemp->errsym->dtnum);
        iVar8 = iVar8 + 1;
      }
      free(__s1);
      free(__ptr_00);
      fwrite("} YYMINORTYPE;\n",0xf,1,(FILE *)out);
      *plineno = iVar8 + 1;
      return;
    }
  }
  print_stack_union_cold_2();
  if ((*(int *)(pcVar17 + 0xc) == *(int *)(pcVar18 + 0xc)) &&
     (pcVar18 != pcVar17 && *(int *)(pcVar18 + 0x10) == *(int *)(pcVar17 + 0x10))) {
    __assert_fail("c!=0 || p1==p2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                  ,0xf81,"int axset_compare(const void *, const void *)");
  }
  return;
}

Assistant:

void print_stack_union(
  FILE *out,                  /* The output stream */
  struct lemon *lemp,         /* The main info structure for this parser */
  int *plineno,               /* Pointer to the line number */
  int mhflag                  /* True if generating makeheaders output */
){
  int lineno = *plineno;    /* The line number of the output */
  char **types;             /* A hash table of datatypes */
  int arraysize;            /* Size of the "types" array */
  int maxdtlength;          /* Maximum length of any ".datatype" field. */
  char *stddt;              /* Standardized name for a datatype */
  int i,j;                  /* Loop counters */
  unsigned hash;            /* For hashing the name of a type */
  const char *name;         /* Name of the parser */

  /* Allocate and initialize types[] and allocate stddt[] */
  arraysize = lemp->nsymbol * 2;
  types = (char**)calloc( arraysize, sizeof(char*) );
  if( types==0 ){
    fprintf(stderr,"Out of memory.\n");
    exit(1);
  }
  maxdtlength = 0;
  if( lemp->vartype ){
    maxdtlength = lemonStrlen(lemp->vartype);
  }
  for(i=0; i<lemp->nsymbol; i++){
    int len;
    struct symbol *sp = lemp->symbols[i];
    if( sp->datatype==0 ) continue;
    len = lemonStrlen(sp->datatype);
    if( len>maxdtlength ) maxdtlength = len;
  }
  stddt = (char*)malloc( maxdtlength*2 + 1 );
  if( types==0 || stddt==0 ){
    fprintf(stderr,"Out of memory.\n");
    exit(1);
  }

  /* Build a hash table of datatypes. The ".dtnum" field of each symbol
  ** is filled in with the hash index plus 1.  A ".dtnum" value of 0 is
  ** used for terminal symbols.  If there is no %default_type defined then
  ** 0 is also used as the .dtnum value for nonterminals which do not specify
  ** a datatype using the %type directive.
  */
  for(i=0; i<lemp->nsymbol; i++){
    struct symbol *sp = lemp->symbols[i];
    char *cp;
    if( sp==lemp->errsym ){
      sp->dtnum = arraysize+1;
      continue;
    }
    if( sp->type!=NONTERMINAL || (sp->datatype==0 && lemp->vartype==0) ){
      sp->dtnum = 0;
      continue;
    }
    cp = sp->datatype;
    if( cp==0 ) cp = lemp->vartype;
    j = 0;
    while( ISSPACE(*cp) ) cp++;
    while( *cp ) stddt[j++] = *cp++;
    while( j>0 && ISSPACE(stddt[j-1]) ) j--;
    stddt[j] = 0;
    if( lemp->tokentype && strcmp(stddt, lemp->tokentype)==0 ){
      sp->dtnum = 0;
      continue;
    }
    hash = 0;
    for(j=0; stddt[j]; j++){
      hash = hash*53 + stddt[j];
    }
    hash = (hash & 0x7fffffff)%arraysize;
    while( types[hash] ){
      if( strcmp(types[hash],stddt)==0 ){
        sp->dtnum = hash + 1;
        break;
      }
      hash++;
      if( hash>=(unsigned)arraysize ) hash = 0;
    }
    if( types[hash]==0 ){
      sp->dtnum = hash + 1;
      types[hash] = (char*)malloc( lemonStrlen(stddt)+1 );
      if( types[hash]==0 ){
        fprintf(stderr,"Out of memory.\n");
        exit(1);
      }
      strcpy(types[hash],stddt);
    }
  }

  /* Print out the definition of YYTOKENTYPE and YYMINORTYPE */
  name = lemp->name ? lemp->name : "Parse";
  lineno = *plineno;
  if( mhflag ){ fprintf(out,"#if INTERFACE\n"); lineno++; }
  fprintf(out,"#define %sTOKENTYPE %s\n",name,
    lemp->tokentype?lemp->tokentype:"void*");  lineno++;
  if( mhflag ){ fprintf(out,"#endif\n"); lineno++; }
  fprintf(out,"typedef union {\n"); lineno++;
  fprintf(out,"  int yyinit;\n"); lineno++;
  fprintf(out,"  %sTOKENTYPE yy0;\n",name); lineno++;
  for(i=0; i<arraysize; i++){
    if( types[i]==0 ) continue;
    fprintf(out,"  %s yy%d;\n",types[i],i+1); lineno++;
    free(types[i]);
  }
  if( lemp->errsym->useCnt ){
    fprintf(out,"  int yy%d;\n",lemp->errsym->dtnum); lineno++;
  }
  free(stddt);
  free(types);
  fprintf(out,"} YYMINORTYPE;\n"); lineno++;
  *plineno = lineno;
}